

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz_tree_renderer.cpp
# Opt level: O0

void __thiscall
duckdb::GRAPHVIZTreeRenderer::ToStreamInternal
          (GRAPHVIZTreeRenderer *this,RenderTree *root,ostream *ss)

{
  undefined1 uVar1;
  bool bVar2;
  RenderTreeNode *pRVar3;
  iterator text;
  ostream *in_RDX;
  long in_RSI;
  string result;
  string edge_lines;
  string node_lines;
  Coordinate *coord;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::RenderTreeNode::Coordinate,_true> *__range3_1;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_raw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  iterator __end3;
  iterator __begin3;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> body
  ;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  idx_t x;
  idx_t y;
  string node_format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  edges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  nodes;
  string digraph_format;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd0;
  allocator *paVar4;
  value_type *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  RenderTreeNode *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffc30;
  optional_ptr<duckdb::RenderTreeNode,_true> in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  string *fmt_str;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [39];
  undefined1 local_299 [33];
  string local_278 [32];
  reference local_258;
  Coordinate *local_250;
  __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
  local_248;
  vector<duckdb::RenderTreeNode::Coordinate,_true> *local_240;
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  reference local_100;
  reference local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_e8;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  RenderTreeNode *local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined1 local_a1 [104];
  undefined1 local_39 [33];
  ostream *local_18;
  long local_10;
  
  fmt_str = (string *)local_39;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_39 + 1),
             "\ndigraph G {\n    node [shape=box, style=rounded, fontname=\"Courier New\", fontsize=10];\n%s\n%s\n}\n\t"
             ,(allocator *)fmt_str);
  ::std::allocator<char>::~allocator((allocator<char> *)local_39);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x158464c);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x1584659);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_a1 + 1),"    node_%d_%d [label=\"%s\"];",(allocator *)params);
  ::std::allocator<char>::~allocator((allocator<char> *)local_a1);
  for (local_b0 = 0; local_b0 < *(ulong *)(local_10 + 0x10); local_b0 = local_b0 + 1) {
    for (local_b8 = 0; local_b8 < *(ulong *)(local_10 + 8); local_b8 = local_b8 + 1) {
      in_stack_fffffffffffffc38 =
           RenderTree::GetNode((RenderTree *)in_stack_fffffffffffffbd8,
                               (idx_t)in_stack_fffffffffffffbd0,(idx_t)in_stack_fffffffffffffbc8);
      local_c0 = in_stack_fffffffffffffc38.ptr;
      uVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_c0);
      if ((bool)uVar1) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)0x15847a4);
        optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                  ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffffbd0);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                           ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffffbd0)
        ;
        local_e0 = &pRVar3->extra_text;
        text = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(in_stack_fffffffffffffbc8);
        local_e8._M_current = text._M_current;
        local_f0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::end(in_stack_fffffffffffffbc8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)in_stack_fffffffffffffbd0,
                                  (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)in_stack_fffffffffffffbc8), bVar2) {
          local_100 = __gnu_cxx::
                      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator*(&local_e8);
          local_108 = &local_100->second;
          local_f8 = local_100;
          QueryProfiler::JSONSanitize(&(text._M_current)->first);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_168,"%s:\\n%s",&local_169);
          ::std::__cxx11::string::string(local_190,(string *)local_100);
          ::std::__cxx11::string::string(local_1b0,local_128);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    (fmt_str,params,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc38.ptr);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
          ::std::__cxx11::string::~string(local_148);
          ::std::__cxx11::string::~string(local_1b0);
          ::std::__cxx11::string::~string(local_190);
          ::std::__cxx11::string::~string(local_168);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
          ::std::__cxx11::string::~string(local_128);
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&local_e8);
        }
        ::std::__cxx11::string::string(local_1f0,(string *)(local_a1 + 1));
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_230,anon_var_dwarf_21e42b6,&local_231);
        StringUtil::Join((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
        StringUtil::Format<unsigned_long,unsigned_long,std::__cxx11::string>
                  (fmt_str,(unsigned_long)params,(unsigned_long)in_stack_fffffffffffffc38.ptr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffc30));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
        ::std::__cxx11::string::~string(local_1d0);
        ::std::__cxx11::string::~string(local_210);
        ::std::__cxx11::string::~string(local_230);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
        ::std::__cxx11::string::~string(local_1f0);
        in_stack_fffffffffffffbe8 =
             optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                       ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffffbd0);
        local_240 = &in_stack_fffffffffffffbe8->child_positions;
        local_248._M_current =
             (Coordinate *)
             std::
             vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ::begin((vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                      *)in_stack_fffffffffffffbc8);
        local_250 = (Coordinate *)
                    std::
                    vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                    ::end((vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           *)in_stack_fffffffffffffbc8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                                   *)in_stack_fffffffffffffbd0,
                                  (__normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                                   *)in_stack_fffffffffffffbc8), bVar2) {
          local_258 = __gnu_cxx::
                      __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                      ::operator*(&local_248);
          in_stack_fffffffffffffbe0 = (string *)local_299;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)(local_299 + 1),"    node_%d_%d -> node_%d_%d;",
                     (allocator *)in_stack_fffffffffffffbe0);
          StringUtil::Format<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (&in_stack_fffffffffffffbe8->name,(unsigned_long)in_stack_fffffffffffffbe0,
                     (unsigned_long)in_stack_fffffffffffffbd8,
                     (unsigned_long)in_stack_fffffffffffffbd0,
                     (unsigned_long)in_stack_fffffffffffffbc8);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
          ::std::__cxx11::string::~string(local_278);
          ::std::__cxx11::string::~string((string *)(local_299 + 1));
          ::std::allocator<char>::~allocator((allocator<char> *)local_299);
          __gnu_cxx::
          __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
          ::operator++(&local_248);
        }
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)0x1584dba);
      }
    }
  }
  paVar4 = &local_2e1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2e0,anon_var_dwarf_3eb6436 + 8,paVar4);
  StringUtil::Join((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  ::std::__cxx11::string::~string(local_2e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  paVar4 = &local_329;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_328,anon_var_dwarf_3eb6436 + 8,paVar4);
  StringUtil::Join((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  ::std::__cxx11::string::~string(local_328);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
  ::std::__cxx11::string::string(local_370,(string *)(local_39 + 1));
  ::std::__cxx11::string::string(local_390,local_2c0);
  ::std::__cxx11::string::string(local_3b0,local_308);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (fmt_str,params,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38.ptr);
  ::std::__cxx11::string::~string(local_3b0);
  ::std::__cxx11::string::~string(local_390);
  ::std::__cxx11::string::~string(local_370);
  ::std::operator<<(local_18,local_350);
  ::std::__cxx11::string::~string(local_350);
  ::std::__cxx11::string::~string(local_308);
  ::std::__cxx11::string::~string(local_2c0);
  ::std::__cxx11::string::~string((string *)(local_a1 + 1));
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x1584fb7);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x1584fc4);
  ::std::__cxx11::string::~string((string *)(local_39 + 1));
  return;
}

Assistant:

void GRAPHVIZTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	const string digraph_format = R"(
digraph G {
    node [shape=box, style=rounded, fontname="Courier New", fontsize=10];
%s
%s
}
	)";

	vector<string> nodes;
	vector<string> edges;

	const string node_format = R"(    node_%d_%d [label="%s"];)";

	for (idx_t y = 0; y < root.height; y++) {
		for (idx_t x = 0; x < root.width; x++) {
			auto node = root.GetNode(x, y);
			if (!node) {
				continue;
			}

			// Create Node
			vector<string> body;
			body.push_back(node->name);
			for (auto &item : node->extra_text) {
				auto &key = item.first;
				auto &value_raw = item.second;

				auto value = QueryProfiler::JSONSanitize(value_raw);
				body.push_back(StringUtil::Format("%s:\\n%s", key, value));
			}
			nodes.push_back(StringUtil::Format(node_format, x, y, StringUtil::Join(body, "\\n───\\n")));

			// Create Edge(s)
			for (auto &coord : node->child_positions) {
				edges.push_back(StringUtil::Format("    node_%d_%d -> node_%d_%d;", x, y, coord.x, coord.y));
			}
		}
	}
	auto node_lines = StringUtil::Join(nodes, "\n");
	auto edge_lines = StringUtil::Join(edges, "\n");

	string result = StringUtil::Format(digraph_format, node_lines, edge_lines);
	ss << result;
}